

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

void __thiscall rapidxml::xml_node<char>::append_node(xml_node<char> *this,xml_node<char> *child)

{
  xml_node<char> **ppxVar1;
  xml_node<char> *pxVar2;
  
  pxVar2 = this->m_last_node;
  ppxVar1 = &pxVar2->m_next_sibling;
  if (this->m_first_node == (xml_node<char> *)0x0) {
    pxVar2 = (xml_node<char> *)0x0;
    ppxVar1 = &this->m_first_node;
  }
  *ppxVar1 = child;
  child->m_prev_sibling = pxVar2;
  this->m_last_node = child;
  (child->super_xml_base<char>).m_parent = this;
  child->m_next_sibling = (xml_node<char> *)0x0;
  return;
}

Assistant:

xml_node<Ch> *first_node(const Ch *name = 0, const Ch *xmlns = 0, std::size_t name_size = 0, std::size_t xmlns_size = 0, bool case_sensitive = true) const
        {
            if (name && !name_size) name_size = internal::measure(name);
            if (xmlns && !xmlns_size) xmlns_size = internal::measure(xmlns);
            if (!xmlns && name) {
                // No XMLNS asked for, but a name is present.
                // Assume "same XMLNS".
                xmlns = this->xmlns();
                xmlns_size = this->xmlns_size();
            }
            for (xml_node<Ch> *child = m_first_node; child; child = child->next_sibling())
                if ((!name || internal::compare(child->name(), child->name_size(), name, name_size, case_sensitive))
                    && (!xmlns || internal::compare(child->xmlns(), child->xmlns_size(), xmlns, xmlns_size, case_sensitive)))
                    return child;
            return 0;
        }